

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  pointer pbVar1;
  int iVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ulong uVar4;
  pointer *__ptr;
  ostream *poVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  allocator local_b9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  ostream *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  std::__cxx11::string::string((string *)&local_50,(test_property->key_)._M_dataplus._M_p,&local_b9)
  ;
  iVar2 = std::__cxx11::string::compare((char *)xml_element);
  if (iVar2 == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<char_const*const*,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               (char **)kReservedTestSuitesAttributes,(char **)kReservedTestSuiteAttributes,
               (allocator_type *)&local_88);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)xml_element);
    if (iVar2 == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const*const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 (char **)kReservedTestSuiteAttributes,(char **)&DAT_00159728,
                 (allocator_type *)&local_88);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)xml_element);
      if (iVar2 == 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<char_const*const*,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   (char **)kReservedTestCaseAttributes,(char **)kReservedOutputTestCaseAttributes,
                   (allocator_type *)&local_88);
      }
      else {
        internal::GTestLog::GTestLog
                  ((GTestLog *)&local_88,GTEST_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
                   ,0x84d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition false failed. ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Unrecognized xml_element provided: ",0x23);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(xml_element->_M_dataplus)._M_p,
                   xml_element->_M_string_length);
        internal::GTestLog::~GTestLog((GTestLog *)&local_88);
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      }
    }
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_50);
  pbVar1 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var3._M_current !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_90);
    local_98 = local_90._M_head_impl;
    poVar5 = (ostream *)(local_90._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
    local_58 = pbVar1;
    local_68 = _Var3._M_current;
    local_60 = poVar5;
    Message::Message((Message *)&local_c8);
    if ((long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar4 = (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      poVar5 = (ostream *)(local_c8._M_head_impl + 0x10);
      lVar6 = 8;
      uVar8 = 0;
      do {
        if (2 < uVar4 && uVar8 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        }
        if (uVar8 == ((long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,*(char **)((long)local_b8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8),
                   *(long *)((long)&((local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'",1);
        uVar8 = uVar8 + 1;
        uVar4 = (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar6 = lVar6 + 0x20;
      } while (uVar8 < uVar4);
    }
    internal::StringStreamToString(&local_88,local_c8._M_head_impl);
    poVar5 = local_60;
    if (local_c8._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))(local_c8._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_88._M_dataplus._M_p,local_88._M_string_length);
    pbVar7 = local_58;
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]bioparser/build_O1/_deps/googletest-src/googletest/src/gtest.cc"
               ,0x876,"Failed");
    _Var3._M_current = local_68;
    internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&local_90);
    internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if (local_98 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return _Var3._M_current == pbVar7;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}